

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::toggleGhosted(Application *this)

{
  bool bVar1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *this_00;
  reference ppSVar2;
  SceneObject *object;
  iterator __end1;
  iterator __begin1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range1;
  Application *this_local;
  
  this->isGhosted = (bool)((this->isGhosted ^ 0xffU) & 1);
  this_00 = &this->scene->objects;
  __end1 = std::
           set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
           ::begin(this_00);
  object = (SceneObject *)
           std::
           set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
           ::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&object);
    if (!bVar1) break;
    ppSVar2 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*(&__end1);
    (*ppSVar2)->isGhosted = (bool)(this->isGhosted & 1);
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void Application::toggleGhosted()
{
  isGhosted = !isGhosted;
  for (auto object : scene->objects)
  {
    object->isGhosted = isGhosted;
  }
}